

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::replace(QString *this,qsizetype pos,qsizetype len,QChar *after,qsizetype alen)

{
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QSpan<unsigned_long,_18446744073709551615UL> indices;
  QStringView after_00;
  size_t index;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->d).size;
  lVar2 = uVar1 - pos;
  if ((ulong)pos <= uVar1) {
    if (lVar2 < len) {
      len = lVar2;
    }
    indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size = 1;
    indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data = &index;
    after_00.m_size = alen;
    after_00.m_data = &after->ucs;
    index = pos;
    replace_helper(this,indices,len,after_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::replace(qsizetype pos, qsizetype len, const QChar *after, qsizetype alen)
{
    if (size_t(pos) > size_t(this->size()))
        return *this;
    if (len > this->size() - pos)
        len = this->size() - pos;

    size_t index = pos;
    replace_helper(*this, QSpan(&index, 1), len, QStringView{after, alen});
    return *this;
}